

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O3

string * __thiscall m2d::savanna::url::port_str_abi_cxx11_(string *__return_storage_ptr__,url *this)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 *puVar6;
  bool bVar7;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  iVar3 = std::__cxx11::string::compare((char *)&this->port_);
  if (iVar3 == 0) {
    pcVar1 = (this->scheme_)._M_dataplus._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->scheme_)._M_string_length);
    puVar6 = local_48;
    if ((local_40 != _DAT_0024e9f8) ||
       ((bVar7 = true, local_40 != 0 &&
        (iVar3 = bcmp(local_48,url_scheme::https_abi_cxx11_,local_40), iVar3 != 0)))) {
      pcVar1 = (this->scheme_)._M_dataplus._M_p;
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + (this->scheme_)._M_string_length);
      puVar2 = local_68;
      if (local_60 == _DAT_0024ea38) {
        if (local_60 == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp(local_68,url_scheme::wss_abi_cxx11_,local_60);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      puVar6 = local_48;
      if (puVar2 != local_58) {
        operator_delete(puVar2);
        puVar6 = local_48;
      }
    }
    if (puVar6 != local_38) {
      operator_delete(puVar6);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar7) {
      pcVar5 = "443";
      pcVar4 = "";
    }
    else {
      pcVar5 = "80";
      pcVar4 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->port_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->port_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string port_str()
		{
			if (port_ == "") {
				if (scheme() == savanna::url_scheme::https || scheme() == savanna::url_scheme::wss) {
					return "443";
				}
				return "80";
			}

			return port_;
		}